

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

int loop_once(int epoll,int sfd,epoll_event *event)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  char *__format;
  undefined8 uStack_370;
  undefined1 local_368 [8];
  epoll_event events [64];
  sockaddr client_addr;
  socklen_t local_40;
  int local_3c;
  socklen_t addrlen;
  
  uVar2 = epoll_wait(epoll,(epoll_event *)local_368,0x40,-1);
  _addrlen = (ulong)uVar2;
  if ((int)uVar2 < 1) {
LAB_00106a0f:
    return (int)_addrlen;
  }
  uVar5 = 0;
  local_3c = sfd;
LAB_0010680f:
  _addrlen = uVar5;
  if ((*(uint *)(local_368 + uVar5 * 0xc) & 0x19) == 1) {
    if (*(int *)((long)&events[uVar5 - 1].data + 4) != sfd) {
      lVar1 = -((ulong)(uint)BUF_SIZE + 0xf & 0xfffffffffffffff0);
      do {
        iVar3 = *(int *)((long)&events[uVar5 - 1].data + 4);
        *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069a4;
        sVar7 = read(iVar3,local_368 + lVar1,(long)BUF_SIZE);
        if (sVar7 == -1) {
          *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069b9;
          piVar6 = __errno_location();
          sfd = local_3c;
          if (*piVar6 == 0xb) goto LAB_00106a03;
          *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069c9;
          sk_on_read_error(epoll,iVar3);
        }
        else if (sVar7 == 0) goto LAB_001069dc;
        *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069da;
        sk_on_read_data(epoll,iVar3,local_368 + lVar1,(int)sVar7);
      } while( true );
    }
    do {
      local_40 = 0x10;
      iVar3 = accept(sfd,(sockaddr *)&events[0x3f].data,&local_40);
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        iVar3 = 8;
        if (*piVar6 != 0xb) {
          printf("\x1b[31mERROR: %s: %s: %d: cannot accept new socket!\x1b[m\n","epoll.cpp",
                 "loop_once",0x68);
          iVar3 = 7;
        }
      }
      else {
        iVar4 = make_socket_non_block(iVar3);
        if (iVar4 == -1) {
          __format = "\x1b[31mERROR: %s: %s: %d: cannot set flags!\x1b[m\n";
          uVar8 = 0x6f;
        }
        else {
          (event->data).fd = iVar3;
          event->events = 0x80000001;
          iVar4 = epoll_ctl(epoll,1,iVar3,(epoll_event *)event);
          if (iVar4 != -1) {
            sk_on_connected(epoll,iVar3);
            iVar3 = 0;
            goto LAB_0010691e;
          }
          __format = "\x1b[31mERROR: %s: %s: %d: cannot add to epoll!\x1b[m\n";
          uVar8 = 0x78;
        }
        printf(__format,"epoll.cpp","loop_once",uVar8);
        sk_on_error(epoll);
        iVar3 = 1;
      }
LAB_0010691e:
    } while ((iVar3 == 0) || (iVar3 == 7));
    if (iVar3 == 8) goto LAB_00106a03;
    goto LAB_00106a0f;
  }
  printf("\x1b[31mERROR: %s: %s: %d: socket fd error!\x1b[m\n","epoll.cpp","loop_once",0x5a);
  close(*(int *)((long)&events[uVar5 - 1].data + 4));
LAB_00106a03:
  _addrlen = _addrlen + 1;
  uVar5 = _addrlen;
  if (_addrlen == uVar2) goto LAB_00106a0f;
  goto LAB_0010680f;
LAB_001069dc:
  iVar4 = *(int *)((long)&events[uVar5 - 1].data + 4);
  *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069e4;
  close(iVar4);
  *(undefined8 *)((long)&uStack_370 + lVar1) = 0x1069ef;
  sk_on_disconnected(epoll,iVar3);
  sfd = local_3c;
  goto LAB_00106a03;
}

Assistant:

static int loop_once(int epoll, int sfd, struct epoll_event &event)
{
    struct epoll_event events[MAX_EVENTS];
    int cnt = epoll_wait(epoll, events, MAX_EVENTS, -1);

    for (int i = 0; i < cnt; i++) {
        if ((events[i].events & EPOLLERR) || (events[i].events & EPOLLHUP) || !(events[i].events & EPOLLIN)) {
            LOGE("socket fd error!");
            close(events[i].data.fd);
            continue;

        } else if (events[i].data.fd == sfd) {
            while (1) {
                struct sockaddr client_addr;
                socklen_t addrlen = sizeof(struct sockaddr);

                int sd = accept(sfd, &client_addr, &addrlen);
                if (sd == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        break;
                    } else {
                        LOGE("cannot accept new socket!");
                        continue;
                    }
                }

                int res = make_socket_non_block(sd);
                if (res == -1) {
                    LOGE("cannot set flags!");
                    sk_on_error(epoll);
                    return -1;
                }

                event.data.fd = sd;
                event.events  = EPOLLET | EPOLLIN;
                res = epoll_ctl(epoll, EPOLL_CTL_ADD, sd, &event);
                if (res == -1) {
                    LOGE("cannot add to epoll!");
                    sk_on_error(epoll);
                    return -1;
                }

                sk_on_connected(epoll, sd);
            }
        } else {
            ssize_t len;
            byte buf[BUF_SIZE];

            while (1) {
                int fd = events[i].data.fd;
                len = read(fd, buf, BUF_SIZE);
                if (len == -1) {
                    if (errno == EAGAIN) {
                        break;
                    }

                    sk_on_read_error(epoll, fd);

                } else if (len == 0) {
                    close(events[i].data.fd);
                    sk_on_disconnected(epoll, fd);
                    break;
                }

                sk_on_read_data(epoll, fd, buf, len);
            }
        }
    }
    return 0;
}